

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_gej *prej,secp256k1_fe *zr,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  secp256k1_gej *a_00;
  undefined4 in_register_0000003c;
  secp256k1_gej *psVar5;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_gej local_168;
  secp256k1_ge local_e8;
  secp256k1_ge local_88;
  
  psVar5 = (secp256k1_gej *)CONCAT44(in_register_0000003c,n);
  secp256k1_gej_double_var(&local_168,(secp256k1_gej *)zr,(secp256k1_fe *)0x0);
  local_e8.x.n[4] = local_168.x.n[4];
  local_e8.x.n[2] = local_168.x.n[2];
  local_e8.x.n[3] = local_168.x.n[3];
  local_e8.x.n[0] = local_168.x.n[0];
  local_e8.x.n[1] = local_168.x.n[1];
  local_e8.y.n[0] = local_168.y.n[0];
  local_e8.y.n[1] = local_168.y.n[1];
  local_e8.y.n[2] = local_168.y.n[2];
  local_e8.y.n[3] = local_168.y.n[3];
  local_e8.y.n[4] = local_168.y.n[4];
  local_e8.infinity = 0;
  secp256k1_ge_set_gej_zinv(&local_88,(secp256k1_gej *)zr,&local_168.z);
  (psVar5->x).n[4] = local_88.x.n[4];
  (psVar5->x).n[2] = local_88.x.n[2];
  (psVar5->x).n[3] = local_88.x.n[3];
  (psVar5->x).n[0] = local_88.x.n[0];
  (psVar5->x).n[1] = local_88.x.n[1];
  (psVar5->y).n[0] = local_88.y.n[0];
  (psVar5->y).n[1] = local_88.y.n[1];
  (psVar5->y).n[2] = local_88.y.n[2];
  (psVar5->y).n[3] = local_88.y.n[3];
  (psVar5->y).n[4] = local_88.y.n[4];
  uVar1 = zr[2].n[0];
  uVar2 = zr[2].n[1];
  uVar3 = zr[2].n[3];
  (psVar5->z).n[2] = zr[2].n[2];
  (psVar5->z).n[3] = uVar3;
  (psVar5->z).n[0] = uVar1;
  (psVar5->z).n[1] = uVar2;
  (psVar5->z).n[4] = zr[2].n[4];
  psVar5->infinity = 0;
  (prej->x).n[4] = local_168.z.n[4];
  (prej->x).n[2] = local_168.z.n[2];
  (prej->x).n[3] = local_168.z.n[3];
  (prej->x).n[0] = local_168.z.n[0];
  (prej->x).n[1] = local_168.z.n[1];
  lVar4 = 0x28;
  a_00 = psVar5;
  do {
    secp256k1_gej_add_ge_var(a_00 + 1,a_00,&local_e8,(secp256k1_fe *)((long)(prej->x).n + lVar4));
    lVar4 = lVar4 + 0x28;
    a_00 = a_00 + 1;
  } while (lVar4 != 0x140);
  secp256k1_fe_mul(&psVar5[7].z,&psVar5[7].z,&local_168.z);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_gej *prej, secp256k1_fe *zr, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge a_ge, d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions on an isomorphism where 'd' is affine: drop the z coordinate
     * of 'd', and scale the 1P starting value's x/y coordinates without changing its z.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&a_ge, a, &d.z);
    prej[0].x = a_ge.x;
    prej[0].y = a_ge.y;
    prej[0].z = a->z;
    prej[0].infinity = 0;

    zr[0] = d.z;
    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&prej[i], &prej[i-1], &d_ge, &zr[i]);
    }

    /*
     * Each point in 'prej' has a z coordinate too small by a factor of 'd.z'. Only
     * the final point's z coordinate is actually used though, so just update that.
     */
    secp256k1_fe_mul(&prej[n-1].z, &prej[n-1].z, &d.z);
}